

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O0

void __thiscall Incppect<true>::Impl::update(Impl *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  const_pointer pvVar4;
  size_type sVar5;
  size_type sVar6;
  char *pcVar7;
  mapped_type *ppPVar8;
  ulong uVar9;
  long in_RDI;
  undefined1 auVar10 [16];
  bool doCompress_1;
  bool doCompress;
  int i_3;
  uint32_t typeAll_1;
  uint32_t n_1;
  uint32_t c_1;
  uint32_t b_1;
  uint32_t a_1;
  uint32_t k;
  uint32_t i_2;
  int i_1;
  uint32_t n;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  int i;
  char v;
  int32_t type;
  int r;
  int padding_bytes;
  int dataSize_bytes;
  int kPadding;
  int64_t tCur;
  value_type *getter;
  type *req;
  type *requestId;
  iterator __end0_1;
  iterator __begin0_1;
  map<int,_Incppect<true>::Impl::Request,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::Request>_>_>
  *__range3;
  uint32_t typeAll;
  vector<char,_std::allocator<char>_> *diffBuffer;
  vector<char,_std::allocator<char>_> *prevBuffer;
  vector<char,_std::allocator<char>_> *curBuffer;
  type *cd;
  type *clientId;
  iterator __end0;
  iterator __begin0;
  map<int,_Incppect<true>::Impl::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_>_>
  *__range2;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  *in_stack_fffffffffffffc50;
  WebSocket<true,_true> *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffc68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffc70;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffc78;
  key_type *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  byte local_271;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  byte local_259;
  vector<char,_std::allocator<char>_> *local_258;
  vector<char,_std::allocator<char>_> *local_250;
  vector<char,_std::allocator<char>_> *local_248;
  vector<char,_std::allocator<char>_> *local_240;
  vector<char,_std::allocator<char>_> *local_238;
  vector<char,_std::allocator<char>_> *local_230;
  vector<char,_std::allocator<char>_> *local_228;
  vector<char,_std::allocator<char>_> *local_220;
  int local_214;
  vector<char,_std::allocator<char>_> *local_210;
  vector<char,_std::allocator<char>_> *local_208;
  undefined4 local_1fc;
  int local_1f8;
  undefined1 local_1f4 [20];
  char *local_1e0;
  vector<char,_std::allocator<char>_> *local_1d8;
  vector<char,_std::allocator<char>_> *local_1d0;
  char *local_1c8;
  char *local_1c0;
  vector<char,_std::allocator<char>_> *local_1b8;
  vector<char,_std::allocator<char>_> *local_1b0;
  vector<char,_std::allocator<char>_> *local_1a8;
  vector<char,_std::allocator<char>_> *local_1a0;
  vector<char,_std::allocator<char>_> *local_198;
  vector<char,_std::allocator<char>_> *local_190;
  vector<char,_std::allocator<char>_> *local_188;
  vector<char,_std::allocator<char>_> *local_180;
  vector<char,_std::allocator<char>_> *local_178;
  vector<char,_std::allocator<char>_> *local_170;
  uint local_168;
  uint local_164;
  vector<char,_std::allocator<char>_> *local_160;
  vector<char,_std::allocator<char>_> *local_158;
  vector<char,_std::allocator<char>_> *local_150;
  vector<char,_std::allocator<char>_> *local_148;
  int local_13c;
  int local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  vector<char,_std::allocator<char>_> *local_128;
  vector<char,_std::allocator<char>_> *local_120;
  int local_118;
  undefined1 local_111;
  vector<char,_std::allocator<char>_> *local_110;
  vector<char,_std::allocator<char>_> *local_108;
  vector<char,_std::allocator<char>_> *local_100;
  vector<char,_std::allocator<char>_> *local_f8;
  vector<char,_std::allocator<char>_> *local_f0;
  vector<char,_std::allocator<char>_> *local_e8;
  vector<char,_std::allocator<char>_> *local_e0;
  vector<char,_std::allocator<char>_> *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  undefined4 local_bc;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  int64_t local_a8;
  reference local_a0;
  type *local_98;
  type *local_90;
  reference local_88;
  _Self local_80;
  _Self local_78;
  map<int,_Incppect<true>::Impl::Request,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::Request>_>_>
  *local_70;
  vector<char,_std::allocator<char>_> *local_68;
  vector<char,_std::allocator<char>_> *local_60;
  undefined4 local_54;
  vector<char,_std::allocator<char>_> *local_50;
  vector<char,_std::allocator<char>_> *local_48;
  vector<char,_std::allocator<char>_> *local_40;
  type *local_38;
  uint *local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 0x128;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_Incppect<true>::Impl::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_>_>
       ::begin((map<int,_Incppect<true>::Impl::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_>_>
                *)in_stack_fffffffffffffc48);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_Incppect<true>::Impl::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_>_>
       ::end((map<int,_Incppect<true>::Impl::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_>_>
              *)in_stack_fffffffffffffc48);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    local_28 = std::_Rb_tree_iterator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_>::
               operator*((_Rb_tree_iterator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_>
                          *)0x21a512);
    local_30 = (uint *)std::get<0ul,int_const,Incppect<true>::Impl::ClientData>
                                 ((pair<const_int,_Incppect<true>::Impl::ClientData> *)0x21a527);
    local_38 = std::get<1ul,int_const,Incppect<true>::Impl::ClientData>
                         ((pair<const_int,_Incppect<true>::Impl::ClientData> *)0x21a53c);
    std::
    map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
    ::operator[]((map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 in_stack_fffffffffffffc88);
    iVar2 = uWS::AsyncSocket<true>::getBufferedAmount((AsyncSocket<true> *)0x21a56c);
    if (iVar2 == 0) {
      local_40 = &local_38->curBuffer;
      local_48 = &local_38->prevBuffer;
      local_50 = &local_38->diffBuffer;
      std::vector<char,_std::allocator<char>_>::clear
                ((vector<char,_std::allocator<char>_> *)0x21a603);
      local_54 = 0;
      local_60 = (vector<char,_std::allocator<char>_> *)
                 std::back_inserter<std::vector<char,std::allocator<char>>>
                           (in_stack_fffffffffffffc48);
      local_68 = (vector<char,_std::allocator<char>_> *)
                 std::copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                           (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                            (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                            in_stack_fffffffffffffc68._M_current);
      local_70 = &local_38->requests;
      local_78._M_node =
           (_Base_ptr)
           std::
           map<int,_Incppect<true>::Impl::Request,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::Request>_>_>
           ::begin((map<int,_Incppect<true>::Impl::Request,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::Request>_>_>
                    *)in_stack_fffffffffffffc48);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<int,_Incppect<true>::Impl::Request,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::Request>_>_>
           ::end((map<int,_Incppect<true>::Impl::Request,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::Request>_>_>
                  *)in_stack_fffffffffffffc48);
      while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
        local_88 = std::_Rb_tree_iterator<std::pair<const_int,_Incppect<true>::Impl::Request>_>::
                   operator*((_Rb_tree_iterator<std::pair<const_int,_Incppect<true>::Impl::Request>_>
                              *)0x21a6c5);
        local_90 = std::get<0ul,int_const,Incppect<true>::Impl::Request>
                             ((pair<const_int,_Incppect<true>::Impl::Request> *)0x21a6da);
        local_98 = std::get<1ul,int_const,Incppect<true>::Impl::Request>
                             ((pair<const_int,_Incppect<true>::Impl::Request> *)0x21a6ef);
        local_a0 = std::
                   vector<std::function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>,_std::allocator<std::function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>_>_>
                   ::operator[]((vector<std::function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>,_std::allocator<std::function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>_>_>
                                 *)(in_RDI + 0xd0),(long)local_98->getterId);
        local_a8 = anon_unknown.dwarf_5e5bc::timestamp();
        if ((((local_98->tLastRequestTimeout_ms < 0) && (0 < local_98->tLastRequested_ms)) ||
            (local_a8 - local_98->tLastRequested_ms < local_98->tLastRequestTimeout_ms)) &&
           (local_98->tMinUpdate_ms < local_a8 - local_98->tLastUpdated_ms)) {
          if (local_98->tLastRequestTimeout_ms < 0) {
            local_98->tLastRequested_ms = 0;
          }
          local_b8 = std::
                     function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
                     ::operator()(in_stack_fffffffffffffc50,
                                  (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc48);
          (local_98->curData)._M_len = local_b8._M_len;
          (local_98->curData)._M_str = local_b8._M_str;
          local_98->tLastUpdated_ms = local_a8;
          local_bc = 4;
          sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_98->curData);
          local_c0 = (int)sVar5;
          local_c4 = 0;
          for (local_c8 = local_c0 % 4; 0 < local_c8 && local_c8 < 4; local_c8 = local_c8 + 1) {
            local_c0 = local_c0 + 1;
            local_c4 = local_c4 + 1;
          }
          local_cc = 0;
          sVar5 = std::vector<char,_std::allocator<char>_>::size(&local_98->prevData);
          sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_98->curData);
          if ((sVar5 == sVar6 + (long)local_c4) &&
             (sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                (&local_98->curData), 0x100 < sVar5)) {
            local_cc = 1;
          }
          local_d8 = (vector<char,_std::allocator<char>_> *)
                     std::back_inserter<std::vector<char,std::allocator<char>>>
                               (in_stack_fffffffffffffc48);
          local_e0 = (vector<char,_std::allocator<char>_> *)
                     std::
                     copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                               (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                in_stack_fffffffffffffc68._M_current);
          local_e8 = (vector<char,_std::allocator<char>_> *)
                     std::back_inserter<std::vector<char,std::allocator<char>>>
                               (in_stack_fffffffffffffc48);
          local_f0 = (vector<char,_std::allocator<char>_> *)
                     std::
                     copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                               (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                in_stack_fffffffffffffc68._M_current);
          if (local_cc == 0) {
            local_f8 = (vector<char,_std::allocator<char>_> *)
                       std::back_inserter<std::vector<char,std::allocator<char>>>
                                 (in_stack_fffffffffffffc48);
            local_100 = (vector<char,_std::allocator<char>_> *)
                        std::
                        copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                   (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                   in_stack_fffffffffffffc68._M_current);
            std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_98->curData);
            std::basic_string_view<char,_std::char_traits<char>_>::end(&local_98->curData);
            local_108 = (vector<char,_std::allocator<char>_> *)
                        std::back_inserter<std::vector<char,std::allocator<char>>>
                                  (in_stack_fffffffffffffc48);
            local_110 = (vector<char,_std::allocator<char>_> *)
                        std::
                        copy<char_const*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                   (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                   in_stack_fffffffffffffc68._M_current);
            local_111 = 0;
            for (local_118 = 0; local_118 < local_c4; local_118 = local_118 + 1) {
              local_120 = (vector<char,_std::allocator<char>_> *)
                          std::back_inserter<std::vector<char,std::allocator<char>>>
                                    (in_stack_fffffffffffffc48);
              local_128 = (vector<char,_std::allocator<char>_> *)
                          std::
                          copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                    (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                     (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
                                      )in_stack_fffffffffffffc68._M_current);
            }
          }
          else if (local_cc == 1) {
            local_12c = 0;
            local_130 = 0;
            local_134 = 0;
            local_138 = 0;
            std::vector<char,_std::allocator<char>_>::clear
                      ((vector<char,_std::allocator<char>_> *)0x21ab77);
            for (local_13c = 0; iVar2 = local_13c,
                sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                  (&local_98->curData), iVar2 < (int)sVar5;
                local_13c = local_13c + 4) {
              pcVar7 = std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)0x21abc4);
              local_12c = *(uint *)(pcVar7 + local_13c);
              pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                 (&local_98->curData);
              local_130 = *(uint *)(pvVar4 + local_13c);
              local_12c = local_12c ^ local_130;
              if (local_12c == local_134) {
                local_138 = local_138 + 1;
              }
              else {
                if (local_138 != 0) {
                  local_148 = (vector<char,_std::allocator<char>_> *)
                              std::back_inserter<std::vector<char,std::allocator<char>>>
                                        (in_stack_fffffffffffffc48);
                  local_150 = (vector<char,_std::allocator<char>_> *)
                              std::
                              copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                        (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58
                                         ,(back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
                                           )in_stack_fffffffffffffc68._M_current);
                  local_158 = (vector<char,_std::allocator<char>_> *)
                              std::back_inserter<std::vector<char,std::allocator<char>>>
                                        (in_stack_fffffffffffffc48);
                  local_160 = (vector<char,_std::allocator<char>_> *)
                              std::
                              copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                        (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58
                                         ,(back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
                                           )in_stack_fffffffffffffc68._M_current);
                }
                local_138 = 1;
                local_134 = local_12c;
              }
            }
            sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_98->curData);
            if ((sVar5 & 3) != 0) {
              local_12c = 0;
              local_130 = 0;
              sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                (&local_98->curData);
              local_164 = (uint)sVar5 & 0xfffffffc;
              sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                (&local_98->curData);
              local_168 = (int)sVar5 - local_164;
              pcVar7 = std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)0x21ad9f);
              memcpy(&local_12c,pcVar7 + local_164,(ulong)local_168);
              pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                 (&local_98->curData);
              memcpy(&local_130,pvVar4 + local_164,(ulong)local_168);
              local_12c = local_12c ^ local_130;
              if (local_12c == local_134) {
                local_138 = local_138 + 1;
              }
              else {
                local_170 = (vector<char,_std::allocator<char>_> *)
                            std::back_inserter<std::vector<char,std::allocator<char>>>
                                      (in_stack_fffffffffffffc48);
                local_178 = (vector<char,_std::allocator<char>_> *)
                            std::
                            copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                      (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                       (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
                                        )in_stack_fffffffffffffc68._M_current);
                local_180 = (vector<char,_std::allocator<char>_> *)
                            std::back_inserter<std::vector<char,std::allocator<char>>>
                                      (in_stack_fffffffffffffc48);
                local_188 = (vector<char,_std::allocator<char>_> *)
                            std::
                            copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                      (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                       (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
                                        )in_stack_fffffffffffffc68._M_current);
                local_138 = 1;
                local_134 = local_12c;
              }
            }
            local_190 = (vector<char,_std::allocator<char>_> *)
                        std::back_inserter<std::vector<char,std::allocator<char>>>
                                  (in_stack_fffffffffffffc48);
            local_198 = (vector<char,_std::allocator<char>_> *)
                        std::
                        copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                   (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                   in_stack_fffffffffffffc68._M_current);
            local_1a0 = (vector<char,_std::allocator<char>_> *)
                        std::back_inserter<std::vector<char,std::allocator<char>>>
                                  (in_stack_fffffffffffffc48);
            local_1a8 = (vector<char,_std::allocator<char>_> *)
                        std::
                        copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                   (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                   in_stack_fffffffffffffc68._M_current);
            sVar5 = std::vector<char,_std::allocator<char>_>::size(&local_98->diffData);
            local_c0 = (int)sVar5;
            local_1b0 = (vector<char,_std::allocator<char>_> *)
                        std::back_inserter<std::vector<char,std::allocator<char>>>
                                  (in_stack_fffffffffffffc48);
            local_1b8 = (vector<char,_std::allocator<char>_> *)
                        std::
                        copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                   (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                   in_stack_fffffffffffffc68._M_current);
            local_1c0 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                          (in_stack_fffffffffffffc48);
            local_1c8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                          (in_stack_fffffffffffffc48);
            local_1d0 = (vector<char,_std::allocator<char>_> *)
                        std::back_inserter<std::vector<char,std::allocator<char>>>
                                  (in_stack_fffffffffffffc48);
            local_1d8 = (vector<char,_std::allocator<char>_> *)
                        std::
                        copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                  (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                                   (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                   in_stack_fffffffffffffc68._M_current);
          }
          std::basic_string_view<char,_std::char_traits<char>_>::size(&local_98->curData);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc70._M_current,
                     (size_type)in_stack_fffffffffffffc68._M_current);
          std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_98->curData);
          std::basic_string_view<char,_std::char_traits<char>_>::end(&local_98->curData);
          local_1e0 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                        (in_stack_fffffffffffffc48);
          local_1f4._12_8_ =
               std::
               copy<char_const*,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                         (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                          in_stack_fffffffffffffc68);
        }
        std::_Rb_tree_iterator<std::pair<const_int,_Incppect<true>::Impl::Request>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_int,_Incppect<true>::Impl::Request>_> *)
                   in_stack_fffffffffffffc50);
      }
      sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40);
      if (4 < sVar5) {
        sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40);
        sVar6 = std::vector<char,_std::allocator<char>_>::size(local_48);
        if ((sVar5 == sVar6) &&
           (sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40), 0x100 < sVar5)) {
          local_1f4._8_4_ = 0;
          local_1f4._4_4_ = 0;
          local_1f4._0_4_ = 0;
          local_1f8 = 0;
          std::vector<char,_std::allocator<char>_>::clear
                    ((vector<char,_std::allocator<char>_> *)0x21b1a2);
          local_1fc = 1;
          local_208 = (vector<char,_std::allocator<char>_> *)
                      std::back_inserter<std::vector<char,std::allocator<char>>>
                                (in_stack_fffffffffffffc48);
          local_210 = (vector<char,_std::allocator<char>_> *)
                      std::
                      copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                 (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                 in_stack_fffffffffffffc68._M_current);
          local_214 = 4;
          while (in_stack_fffffffffffffc94 = local_214,
                sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40),
                in_stack_fffffffffffffc94 < (int)sVar5) {
            pcVar7 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)0x21b234);
            local_1f4._8_4_ = *(undefined4 *)(pcVar7 + local_214);
            pcVar7 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)0x21b253);
            local_1f4._4_4_ = *(undefined4 *)(pcVar7 + local_214);
            local_1f4._8_4_ = local_1f4._8_4_ ^ local_1f4._4_4_;
            if (local_1f4._8_4_ == local_1f4._0_4_) {
              local_1f8 = local_1f8 + 1;
            }
            else {
              if (local_1f8 != 0) {
                local_220 = (vector<char,_std::allocator<char>_> *)
                            std::back_inserter<std::vector<char,std::allocator<char>>>
                                      (in_stack_fffffffffffffc48);
                local_228 = (vector<char,_std::allocator<char>_> *)
                            std::
                            copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                      (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                       (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
                                        )in_stack_fffffffffffffc68._M_current);
                in_stack_fffffffffffffc88 = (key_type *)(local_1f4 + 4);
                local_230 = (vector<char,_std::allocator<char>_> *)
                            std::back_inserter<std::vector<char,std::allocator<char>>>
                                      (in_stack_fffffffffffffc48);
                local_238 = (vector<char,_std::allocator<char>_> *)
                            std::
                            copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                      (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                       (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
                                        )in_stack_fffffffffffffc68._M_current);
              }
              local_1f8 = 1;
              local_1f4._0_4_ = local_1f4._8_4_;
            }
            local_214 = local_214 + 4;
          }
          in_stack_fffffffffffffc70._M_current = local_1f4;
          local_240 = (vector<char,_std::allocator<char>_> *)
                      std::back_inserter<std::vector<char,std::allocator<char>>>
                                (in_stack_fffffffffffffc48);
          local_248 = (vector<char,_std::allocator<char>_> *)
                      std::
                      copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                 (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                 in_stack_fffffffffffffc68._M_current);
          in_stack_fffffffffffffc78._M_current = local_1f4 + 4;
          local_250 = (vector<char,_std::allocator<char>_> *)
                      std::back_inserter<std::vector<char,std::allocator<char>>>
                                (in_stack_fffffffffffffc48);
          local_258 = (vector<char,_std::allocator<char>_> *)
                      std::
                      copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                                 (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
                                 in_stack_fffffffffffffc68._M_current);
          sVar5 = std::vector<char,_std::allocator<char>_>::size(local_50);
          if (*(int *)(in_RDI + 4) < (int)sVar5) {
            sVar5 = std::vector<char,_std::allocator<char>_>::size(local_50);
            printf("[incppect] warning: buffer size (%d) exceeds maxPayloadLength (%d)\n",
                   sVar5 & 0xffffffff,(ulong)*(uint *)(in_RDI + 4));
          }
          sVar5 = std::vector<char,_std::allocator<char>_>::size(local_50);
          local_259 = 0x40 < sVar5;
          ppPVar8 = std::
                    map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                    ::operator[]((map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                 in_stack_fffffffffffffc88);
          in_stack_fffffffffffffc68._M_current = (char *)(*ppPVar8)->ws;
          in_stack_fffffffffffffc60 =
               std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x21b496);
          sVar5 = std::vector<char,_std::allocator<char>_>::size(local_50);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_270,in_stack_fffffffffffffc60,sVar5);
          uVar9 = uWS::WebSocket<true,_true>::send
                            ((WebSocket<true,_true> *)in_stack_fffffffffffffc68._M_current,
                             (int)local_270._M_len,local_270._M_str,2,(uint)(local_259 & 1));
          if ((uVar9 & 1) == 0) {
            printf("[incpeect] warning: backpressure for client %d increased \n",(ulong)*local_30);
          }
        }
        else {
          sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40);
          if (*(int *)(in_RDI + 4) < (int)sVar5) {
            sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40);
            printf("[incppect] warning: buffer size (%d) exceeds maxPayloadLength (%d)\n",
                   sVar5 & 0xffffffff,(ulong)*(uint *)(in_RDI + 4));
          }
          sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40);
          local_271 = 0x40 < sVar5;
          ppPVar8 = std::
                    map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                    ::operator[]((map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                 in_stack_fffffffffffffc88);
          in_stack_fffffffffffffc58 = (*ppPVar8)->ws;
          in_stack_fffffffffffffc50 =
               (function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
                *)std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)0x21b5a7);
          sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_288,(char *)in_stack_fffffffffffffc50,sVar5);
          uVar9 = uWS::WebSocket<true,_true>::send
                            (in_stack_fffffffffffffc58,(int)local_288._M_len,local_288._M_str,2,
                             (uint)(local_271 & 1));
          if ((uVar9 & 1) == 0) {
            printf("[incpeect] warning: backpressure for client %d increased \n",(ulong)*local_30);
          }
        }
        sVar5 = std::vector<char,_std::allocator<char>_>::size(local_40);
        auVar10._8_4_ = (int)(sVar5 >> 0x20);
        auVar10._0_8_ = sVar5;
        auVar10._12_4_ = 0x45300000;
        *(double *)(in_RDI + 0x90) =
             (auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0) +
             *(double *)(in_RDI + 0x90);
        in_stack_fffffffffffffc48 = local_48;
        std::vector<char,_std::allocator<char>_>::size(local_40);
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc70._M_current,
                   (size_type)in_stack_fffffffffffffc68._M_current);
        std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffc48);
        std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffc48);
        std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffc48);
        std::
        copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      }
    }
    else {
      std::
      map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
      ::operator[]((map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                   in_stack_fffffffffffffc88);
      uVar3 = uWS::AsyncSocket<true>::getBufferedAmount((AsyncSocket<true> *)0x21a599);
      printf("[incppect] warning: buffered amount = %d, not sending updates to client %d. waiting for buffer to drain\n"
             ,(ulong)uVar3,(ulong)*local_30);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_Incppect<true>::Impl::ClientData>_> *)
               in_stack_fffffffffffffc50);
  }
  return;
}

Assistant:

void update() {
        for (auto & [clientId, cd] : clientData) {
            if (socketData[clientId]->ws->getBufferedAmount()) {
                my_printf("[incppect] warning: buffered amount = %d, not sending updates to client %d. waiting for buffer to drain\n", socketData[clientId]->ws->getBufferedAmount(), clientId);
                continue;
            }

            auto & curBuffer = cd.curBuffer;
            auto & prevBuffer = cd.prevBuffer;
            auto & diffBuffer = cd.diffBuffer;

            curBuffer.clear();

            uint32_t typeAll = 0;
            std::copy((char *)(&typeAll), (char *)(&typeAll) + sizeof(typeAll), std::back_inserter(curBuffer));

            for (auto & [requestId, req] : cd.requests) {
                auto & getter = getters[req.getterId];
                auto tCur = ::timestamp();
                if (((req.tLastRequestTimeout_ms < 0 && req.tLastRequested_ms > 0) || (tCur - req.tLastRequested_ms < req.tLastRequestTimeout_ms)) &&
                    tCur - req.tLastUpdated_ms > req.tMinUpdate_ms) {
                    if (req.tLastRequestTimeout_ms < 0) {
                        req.tLastRequested_ms = 0;
                    }

                    req.curData = getter(req.idxs);
                    req.tLastUpdated_ms = tCur;

                    const int kPadding = 4;

                    int dataSize_bytes = req.curData.size();
                    int padding_bytes = 0;
                    {
                        int r = dataSize_bytes%kPadding;
                        while (r > 0 && r < kPadding) {
                            ++dataSize_bytes;
                            ++padding_bytes;
                            ++r;
                        }
                    }

                    int32_t type = 0; // full update
                    if (req.prevData.size() == req.curData.size() + padding_bytes && req.curData.size() > 256) {
                        type = 1; // run-length encoding of diff
                    }

                    std::copy((char *)(&requestId), (char *)(&requestId) + sizeof(requestId), std::back_inserter(curBuffer));
                    std::copy((char *)(&type), (char *)(&type) + sizeof(type), std::back_inserter(curBuffer));

                    if (type == 0) {
                        std::copy((char *)(&dataSize_bytes), (char *)(&dataSize_bytes) + sizeof(dataSize_bytes), std::back_inserter(curBuffer));
                        std::copy(req.curData.begin(), req.curData.end(), std::back_inserter(curBuffer));
                        {
                            char v = 0;
                            for (int i = 0; i < padding_bytes; ++i) {
                                std::copy((char *)(&v), (char *)(&v) + sizeof(v), std::back_inserter(curBuffer));
                            }
                        }
                    } else if (type == 1) {
                        uint32_t a = 0;
                        uint32_t b = 0;
                        uint32_t c = 0;
                        uint32_t n = 0;
                        req.diffData.clear();

                        for (int i = 0; i < (int) req.curData.size(); i += 4) {
                            std::memcpy((char *)(&a), req.prevData.data() + i, sizeof(uint32_t));
                            std::memcpy((char *)(&b), req.curData.data() + i, sizeof(uint32_t));
                            a = a ^ b;
                            if (a == c) {
                                ++n;
                            } else {
                                if (n > 0) {
                                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(req.diffData));
                                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(req.diffData));
                                }
                                n = 1;
                                c = a;
                            }
                        }

                        if (req.curData.size() % 4 != 0) {
                            a = 0;
                            b = 0;
                            uint32_t i = (req.curData.size()/4)*4;
                            uint32_t k = req.curData.size() - i;
                            std::memcpy((char *)(&a), req.prevData.data() + i, k);
                            std::memcpy((char *)(&b), req.curData.data() + i, k);
                            a = a ^ b;
                            if (a == c) {
                                ++n;
                            } else {
                                std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(req.diffData));
                                std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(req.diffData));
                                n = 1;
                                c = a;
                            }
                        }

                        std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(req.diffData));
                        std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(req.diffData));

                        dataSize_bytes = req.diffData.size();
                        std::copy((char *)(&dataSize_bytes), (char *)(&dataSize_bytes) + sizeof(dataSize_bytes), std::back_inserter(curBuffer));
                        std::copy(req.diffData.begin(), req.diffData.end(), std::back_inserter(curBuffer));
                    }

                    req.prevData.resize(req.curData.size());
                    std::copy(req.curData.begin(), req.curData.end(), req.prevData.begin());
                }
            }

            if (curBuffer.size() > 4) {
                if (curBuffer.size() == prevBuffer.size() && curBuffer.size() > 256) {
                    uint32_t a = 0;
                    uint32_t b = 0;
                    uint32_t c = 0;
                    uint32_t n = 0;
                    diffBuffer.clear();

                    uint32_t typeAll = 1;
                    std::copy((char *)(&typeAll), (char *)(&typeAll) + sizeof(typeAll), std::back_inserter(diffBuffer));

                    for (int i = 4; i < (int) curBuffer.size(); i += 4) {
                        std::memcpy((char *)(&a), prevBuffer.data() + i, sizeof(uint32_t));
                        std::memcpy((char *)(&b), curBuffer.data() + i, sizeof(uint32_t));
                        a = a ^ b;
                        if (a == c) {
                            ++n;
                        } else {
                            if (n > 0) {
                                std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(diffBuffer));
                                std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(diffBuffer));
                            }
                            n = 1;
                            c = a;
                        }
                    }

                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(diffBuffer));
                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(diffBuffer));

                    if ((int32_t) diffBuffer.size() > parameters.maxPayloadLength_bytes) {
                        my_printf("[incppect] warning: buffer size (%d) exceeds maxPayloadLength (%d)\n", (int) diffBuffer.size(), parameters.maxPayloadLength_bytes);
                    }

                    // compress only for message larger than 64 bytes
                    bool doCompress = diffBuffer.size() > 64;

                    if (socketData[clientId]->ws->send({ diffBuffer.data(), diffBuffer.size() }, uWS::OpCode::BINARY, doCompress) == false) {
                        my_printf("[incpeect] warning: backpressure for client %d increased \n", clientId);
                    }
                } else {
                    if ((int32_t) curBuffer.size() > parameters.maxPayloadLength_bytes) {
                        my_printf("[incppect] warning: buffer size (%d) exceeds maxPayloadLength (%d)\n", (int) curBuffer.size(), parameters.maxPayloadLength_bytes);
                    }

                    // compress only for message larger than 64 bytes
                    bool doCompress = curBuffer.size() > 64;

                    if (socketData[clientId]->ws->send({ curBuffer.data(), curBuffer.size() }, uWS::OpCode::BINARY, doCompress) == false) {
                        my_printf("[incpeect] warning: backpressure for client %d increased \n", clientId);
                    }
                }

                txTotal_bytes += curBuffer.size();

                prevBuffer.resize(curBuffer.size());
                std::copy(curBuffer.begin(), curBuffer.end(), prevBuffer.begin());
            }
        }
    }